

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.h
# Opt level: O0

path * __thiscall filesystem::path::make_absolute(path *this)

{
  char *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  int *piVar2;
  path *in_RDI;
  char temp [4096];
  undefined4 in_stack_ffffffffffffef70;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffef74;
  char *in_stack_ffffffffffffef78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffef80;
  char *in_stack_ffffffffffffef88;
  path *in_stack_ffffffffffffef90;
  string local_1058 [32];
  string local_1038 [32];
  char local_1018 [284];
  path_type in_stack_fffffffffffff104;
  path *in_stack_fffffffffffff108;
  
  str_abi_cxx11_(in_stack_fffffffffffff108,in_stack_fffffffffffff104);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  pcVar1 = realpath(pcVar1,local_1018);
  std::__cxx11::string::~string(local_1038);
  if (pcVar1 == (char *)0x0) {
    uVar3 = CONCAT13(1,(int3)in_stack_ffffffffffffef70);
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            __cxa_allocate_exception(0x10);
    piVar2 = __errno_location();
    pcVar1 = strerror(*piVar2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffef80,in_stack_ffffffffffffef78,
               (allocator<char> *)CONCAT44(in_stack_ffffffffffffef74,uVar3));
    std::operator+(pcVar1,__rhs);
    std::runtime_error::runtime_error((runtime_error *)__rhs,local_1058);
    __cxa_throw(__rhs,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  path(in_stack_ffffffffffffef90,in_stack_ffffffffffffef88);
  return in_RDI;
}

Assistant:

path make_absolute() const {
#if !defined(_WIN32)
        char temp[PATH_MAX];
        if (realpath(str().c_str(), temp) == NULL)
            throw std::runtime_error("Internal error in realpath(): " + std::string(strerror(errno)));
        return path(temp);
#else
        std::wstring value = wstr(), out(MAX_PATH_WINDOWS, '\0');
        DWORD length = GetFullPathNameW(value.c_str(), MAX_PATH_WINDOWS, &out[0], NULL);
        if (length == 0)
            throw std::runtime_error("Internal error in realpath(): " + std::to_string(GetLastError()));
        return path(out.substr(0, length));
#endif
    }